

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O0

void PrintExceptionContinue(exception *pex,string_view thread_name)

{
  string_view thread_name_00;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string_view in_stack_00000010;
  string message;
  Level in_stack_000000f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000100;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff4c;
  exception *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  ostream *out;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  LogFlags in_stack_ffffffffffffffb0;
  int source_line;
  ConstevalFormatString<1U> fmt;
  
  source_line = (int)((ulong)in_RSI >> 0x20);
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  out = (ostream *)&stack0xffffffffffffffd8;
  thread_name_00._M_str = in_stack_ffffffffffffff88;
  thread_name_00._M_len = in_stack_ffffffffffffff80;
  FormatException_abi_cxx11_(in_stack_ffffffffffffff58,thread_name_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  uVar1 = 2;
  LogPrintFormatInternal<std::__cxx11::string>
            (in_stack_00000010,in_stack_00000000,source_line,in_stack_ffffffffffffffb0,
             in_stack_000000f0,fmt,in_stack_00000100);
  tinyformat::format<std::__cxx11::string>
            (out,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,uVar1));
  if (*(char **)(in_FS_OFFSET + 0x28) == fmt.fmt) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrintExceptionContinue(const std::exception* pex, std::string_view thread_name)
{
    std::string message = FormatException(pex, thread_name);
    LogPrintf("\n\n************************\n%s\n", message);
    tfm::format(std::cerr, "\n\n************************\n%s\n", message);
}